

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_22bf96::TryGetMemberAccessPointerAndOffset
                    (ExpressionContext *ctx,VmInstruction *address,VmConstant *offset,
                    VmConstant **totalOffset)

{
  uint uVar1;
  VmValue *pVVar2;
  VmConstant *pVVar3;
  VmValue **ppVVar4;
  VmValue *pVVar5;
  
  if (address->cmd == VM_INST_ADD) {
    uVar1 = (address->arguments).count;
    if (uVar1 == 0) {
LAB_0027b653:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    ppVVar4 = (address->arguments).data;
    pVVar2 = *ppVVar4;
    if ((pVVar2 == (VmValue *)0x0) || (pVVar2->typeID != 1)) {
      pVVar2 = (VmValue *)0x0;
    }
    if (uVar1 == 1) goto LAB_0027b653;
    pVVar5 = ppVVar4[1];
    if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
      pVVar5 = (VmValue *)0x0;
    }
    if ((pVVar2 == (VmValue *)0x0) ||
       (pVVar2[1].comment.end != (char *)0x0 || pVVar5 != (VmValue *)0x0)) {
      if ((pVVar5 == (VmValue *)0x0) ||
         (pVVar2 != (VmValue *)0x0 || pVVar5[1].comment.end != (char *)0x0)) goto LAB_0027b5ee;
      pVVar3 = CreateConstantInt((Allocator *)ctx,(SynBase *)0x0,
                                 *(int *)&pVVar5[1]._vptr_VmValue + offset->iValue);
      *totalOffset = pVVar3;
      if ((address->arguments).count == 0) goto LAB_0027b653;
      ppVVar4 = (address->arguments).data;
    }
    else {
      pVVar3 = CreateConstantInt((Allocator *)ctx,(SynBase *)0x0,
                                 *(int *)&pVVar2[1]._vptr_VmValue + offset->iValue);
      *totalOffset = pVVar3;
      if ((address->arguments).count < 2) goto LAB_0027b653;
      ppVVar4 = (address->arguments).data + 1;
    }
    pVVar2 = *ppVVar4;
  }
  else {
LAB_0027b5ee:
    pVVar2 = (VmValue *)0x0;
  }
  return pVVar2;
}

Assistant:

VmValue* TryGetMemberAccessPointerAndOffset(ExpressionContext &ctx, VmInstruction *address, VmConstant *offset, VmConstant **totalOffset)
	{
		if(address->cmd == VM_INST_ADD)
		{
			VmConstant *lhsAsConstant = getType<VmConstant>(address->arguments[0]);
			VmConstant *rhsAsConstant = getType<VmConstant>(address->arguments[1]);

			if(lhsAsConstant && !lhsAsConstant->container && !rhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + lhsAsConstant->iValue);

				return address->arguments[1];
			}
			else if(rhsAsConstant && !rhsAsConstant->container && !lhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + rhsAsConstant->iValue);

				return address->arguments[0];
			}
		}

		return NULL;
	}